

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O0

size_t Imf_3_3::checkArraySize<unsigned_int>(uint n,size_t s)

{
  OverflowExc *this;
  unsigned_long uVar1;
  char *text;
  ulong in_RSI;
  uint in_EDI;
  StaticAssertionFailed<true> staticAssertionFailed_1;
  StaticAssertionFailed<true> staticAssertionFailed;
  
  this = (OverflowExc *)(ulong)in_EDI;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if ((OverflowExc *)(uVar1 / in_RSI) < this) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::OverflowExc::OverflowExc(this,text);
    __cxa_throw(text,&Iex_3_3::OverflowExc::typeinfo,Iex_3_3::OverflowExc::~OverflowExc);
  }
  return (ulong)in_EDI;
}

Assistant:

inline size_t
checkArraySize (T n, size_t s)
{
    //
    // Verify that the size, in bytes, of an array with n elements
    // of size s can be computed without overflowing:
    //
    // If computing
    //
    //      size_t (n) * s
    //
    // would overflow, then throw an IEX_NAMESPACE::OverflowExc exception.
    // Otherwise return
    //
    //      size_t (n).
    //

    IMF_STATIC_ASSERT (
        !std::numeric_limits<T>::is_signed &&
        std::numeric_limits<T>::is_integer);

    IMF_STATIC_ASSERT (sizeof (T) <= sizeof (size_t));

    if (size_t (n) > std::numeric_limits<size_t>::max () / s)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return size_t (n);
}